

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniversalConstraint.cpp
# Opt level: O1

void __thiscall
btUniversalConstraint::setAxis(btUniversalConstraint *this,btVector3 *axis1,btVector3 *axis2)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_38;
  float local_34;
  float local_30;
  undefined8 local_28;
  float local_20;
  
  uVar5 = *(undefined8 *)(axis1->m_floats + 2);
  *(undefined8 *)(this->m_axis1).m_floats = *(undefined8 *)axis1->m_floats;
  *(undefined8 *)((this->m_axis1).m_floats + 2) = uVar5;
  uVar5 = *(undefined8 *)(axis2->m_floats + 2);
  *(undefined8 *)(this->m_axis2).m_floats = *(undefined8 *)axis2->m_floats;
  *(undefined8 *)((this->m_axis2).m_floats + 2) = uVar5;
  fVar13 = (float)*(undefined8 *)axis1->m_floats;
  fVar14 = (float)((ulong)*(undefined8 *)axis1->m_floats >> 0x20);
  fVar12 = axis1->m_floats[2];
  fVar6 = fVar12 * fVar12 + fVar13 * fVar13 + fVar14 * fVar14;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar6 = 1.0 / fVar6;
  fVar13 = fVar13 * fVar6;
  fVar14 = fVar14 * fVar6;
  fVar12 = fVar12 * fVar6;
  fVar8 = (float)*(undefined8 *)axis2->m_floats;
  fVar15 = (float)((ulong)*(undefined8 *)axis2->m_floats >> 0x20);
  fVar6 = axis2->m_floats[2];
  fVar7 = fVar6 * fVar6 + fVar8 * fVar8 + fVar15 * fVar15;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = 1.0 / fVar7;
  fVar8 = fVar8 * fVar7;
  fVar15 = fVar15 * fVar7;
  fVar6 = fVar6 * fVar7;
  fVar9 = fVar15 * fVar12 - fVar14 * fVar6;
  fVar10 = fVar6 * fVar13 - fVar12 * fVar8;
  fVar11 = fVar8 * fVar14 - fVar13 * fVar15;
  fVar7 = (this->m_anchor).m_floats[0];
  fVar1 = (this->m_anchor).m_floats[1];
  fVar2 = (this->m_anchor).m_floats[2];
  btTransform::inverse
            (&(((this->super_btGeneric6DofConstraint).super_btTypedConstraint.m_rbA)->
              super_btCollisionObject).m_worldTransform);
  fVar16 = (float)((ulong)local_28 >> 0x20);
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats =
       CONCAT44(local_50 * fVar6 + local_58 * fVar8 + local_54 * fVar15,
                local_50 * fVar11 + local_58 * fVar9 + local_54 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats[2] =
       fVar12 * local_50 + fVar13 * local_58 + fVar14 * local_54;
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats =
       CONCAT44(local_40 * fVar6 + local_48 * fVar8 + local_44 * fVar15,
                local_40 * fVar11 + local_48 * fVar9 + local_44 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats[2] =
       fVar12 * local_40 + fVar13 * local_48 + fVar14 * local_44;
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats =
       CONCAT44(local_30 * fVar6 + local_38 * fVar8 + local_34 * fVar15,
                local_30 * fVar11 + local_38 * fVar9 + local_34 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats[2] =
       fVar12 * local_30 + fVar13 * local_38 + fVar14 * local_34;
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats[3] = 0.0;
  auVar4._4_4_ = fVar16 + local_40 * fVar2 + local_48 * fVar7 + local_44 * fVar1;
  auVar4._0_4_ = (float)local_28 + local_50 * fVar2 + local_58 * fVar7 + local_54 * fVar1;
  auVar4._8_4_ = fVar2 * local_30 + fVar7 * local_38 + fVar1 * local_34 + local_20;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_btGeneric6DofConstraint).m_frameInA.m_origin.m_floats = auVar4;
  btTransform::inverse
            (&(((this->super_btGeneric6DofConstraint).super_btTypedConstraint.m_rbB)->
              super_btCollisionObject).m_worldTransform);
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats =
       CONCAT44(local_50 * fVar6 + local_58 * fVar8 + local_54 * fVar15,
                local_50 * fVar11 + local_58 * fVar9 + local_54 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats[2] =
       fVar12 * local_50 + fVar13 * local_58 + fVar14 * local_54;
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats =
       CONCAT44(local_40 * fVar6 + local_48 * fVar8 + local_44 * fVar15,
                local_40 * fVar11 + local_48 * fVar9 + local_44 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats[2] =
       fVar12 * local_40 + fVar13 * local_48 + fVar14 * local_44;
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats =
       CONCAT44(local_30 * fVar6 + local_38 * fVar8 + local_34 * fVar15,
                local_30 * fVar11 + local_38 * fVar9 + local_34 * fVar10);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats[2] =
       fVar12 * local_30 + fVar13 * local_38 + fVar14 * local_34;
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats[3] = 0.0;
  auVar3._4_4_ = fVar16 + local_40 * fVar2 + local_48 * fVar7 + local_44 * fVar1;
  auVar3._0_4_ = (float)local_28 + local_50 * fVar2 + local_58 * fVar7 + local_54 * fVar1;
  auVar3._8_4_ = fVar2 * local_30 + fVar7 * local_38 + fVar1 * local_34 + local_20;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_btGeneric6DofConstraint).m_frameInB.m_origin.m_floats = auVar3;
  btGeneric6DofConstraint::calculateTransforms(&this->super_btGeneric6DofConstraint);
  return;
}

Assistant:

void btUniversalConstraint::setAxis(const btVector3& axis1,const btVector3& axis2)
{
  m_axis1 = axis1;
  m_axis2 = axis2;

	btVector3 zAxis = axis1.normalized();
	btVector3 yAxis = axis2.normalized();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system

	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue(	xAxis[0], yAxis[0], zAxis[0],	
                                xAxis[1], yAxis[1], zAxis[1],
                                xAxis[2], yAxis[2], zAxis[2]);
	frameInW.setOrigin(m_anchor);

	// now get constraint frame in local coordinate systems
	m_frameInA = m_rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = m_rbB.getCenterOfMassTransform().inverse() * frameInW;

  calculateTransforms();
}